

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_jcc(ASMState *as,int cc,MCode *target)

{
  MCode *pMVar1;
  MCode *p;
  MCode *target_local;
  int cc_local;
  ASMState *as_local;
  ptrdiff_t delta;
  
  pMVar1 = as->mcp;
  *(int *)(pMVar1 + -4) = (int)target - (int)pMVar1;
  pMVar1[-5] = ((byte)cc & 0xf) + 0x80;
  pMVar1[-6] = '\x0f';
  as->mcp = pMVar1 + -6;
  return;
}

Assistant:

static void emit_jcc(ASMState *as, int cc, MCode *target)
{
  MCode *p = as->mcp;
  *(int32_t *)(p-4) = jmprel(p, target);
  p[-5] = (MCode)(XI_JCCn+(cc&15));
  p[-6] = 0x0f;
  as->mcp = p - 6;
}